

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  char cVar1;
  float *pfVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  float fVar4;
  char sums8;
  float scale_out;
  float sumfp32;
  float scale_in;
  int wt;
  int val;
  int k;
  char *sptr;
  Mat m_1;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  char *outptr;
  int p;
  size_t out_elemsize;
  bool use_int8_requantize;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_2;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Option *in_stack_fffffffffffff8f8;
  float in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  Mat *in_stack_fffffffffffff908;
  void **ppvVar5;
  Convolution *in_stack_fffffffffffff910;
  size_t in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  undefined8 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  float local_6c4;
  bool local_5f9;
  Option *in_stack_fffffffffffffa08;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  Mat *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  float local_5b4;
  float local_5b0;
  int local_5a4;
  undefined8 local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined4 local_580;
  long *local_578;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined8 local_558;
  int local_54c;
  long local_548;
  int local_53c;
  int local_538;
  int local_534;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined4 local_518;
  long local_510;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined8 local_4f0;
  float *local_4e8;
  int local_4dc;
  ulong local_4d8;
  byte local_4cd;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  reference local_4b8;
  vector<int,_std::allocator<int>_> local_4a8;
  int local_48c;
  int local_488;
  int local_484;
  void *local_480;
  int *local_478;
  long local_470;
  undefined4 local_468;
  long *local_460;
  undefined4 local_458;
  int local_454;
  int local_450;
  undefined4 local_44c;
  int local_448;
  long local_440;
  undefined4 local_438;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  void *local_3e0;
  int *local_3d8;
  long local_3d0;
  undefined4 local_3c8;
  long *local_3c0;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  int local_3a8;
  long local_3a0;
  int local_398;
  int local_394;
  long local_390;
  int local_384;
  int local_380;
  int local_37c;
  long *local_370;
  int local_354;
  void **local_350;
  undefined8 *local_348;
  undefined8 *local_338;
  void **local_328;
  void **local_318;
  long *local_308;
  void **local_300;
  void **local_2f8;
  void **local_2e8;
  undefined1 local_2dd;
  int local_2dc;
  void **local_2d8;
  undefined8 *local_2d0;
  undefined1 local_2bd;
  int local_2bc;
  undefined8 *local_2b0;
  undefined8 *local_2a0;
  long *local_298;
  int local_28c;
  undefined8 *local_288;
  undefined8 local_280;
  long local_278;
  long local_270;
  long *local_268;
  long local_260;
  long *local_258;
  undefined8 local_250;
  undefined8 *local_248;
  long local_240;
  long *local_238;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  long *local_208;
  undefined4 local_200;
  float local_1fc [3];
  long *local_1f0;
  undefined8 local_1e8;
  long *local_1e0;
  undefined8 local_1d8;
  long *local_1d0;
  undefined8 local_1c8;
  long *local_1c0;
  undefined8 local_1b8;
  long *local_1b0;
  int local_178;
  undefined4 local_174;
  void **local_170;
  int local_158;
  undefined4 local_154;
  void **local_150;
  undefined8 *local_130;
  undefined8 *local_110;
  void *local_e8;
  void *local_d8;
  void **local_b8;
  void **local_b0;
  long *local_a8;
  long local_a0;
  undefined4 local_94;
  long local_90;
  float *local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  long *local_68;
  undefined4 local_5c;
  long local_58;
  void *local_50;
  undefined4 local_44;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_37c = *(int *)((long)in_RSI + 0x2c);
  local_380 = (int)in_RSI[6];
  local_384 = (int)in_RSI[7];
  local_390 = in_RSI[2];
  local_394 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_398 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_2e8 = &local_3e0;
  local_3e0 = (void *)*in_RSI;
  local_3d8 = (int *)in_RSI[1];
  local_3d0 = in_RSI[2];
  local_3c8 = (undefined4)in_RSI[3];
  local_3c0 = (long *)in_RSI[4];
  local_3b8 = (undefined4)in_RSI[5];
  local_3b4 = *(undefined4 *)((long)in_RSI + 0x2c);
  local_3b0 = (undefined4)in_RSI[6];
  local_3ac = *(undefined4 *)((long)in_RSI + 0x34);
  local_3a8 = (int)in_RSI[7];
  local_3a0 = in_RSI[8];
  if (local_3d8 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_3d8;
    *local_3d8 = *local_3d8 + 1;
    UNLOCK();
  }
  local_370 = in_RDX;
  local_8 = local_2e8;
  if (local_390 != 1) {
    local_428 = *in_RCX;
    local_418 = *(undefined4 *)(in_RCX + 2);
    uStack_414 = *(undefined4 *)((long)in_RCX + 0x14);
    uStack_410 = *(undefined4 *)(in_RCX + 3);
    uStack_40c = *(undefined4 *)((long)in_RCX + 0x1c);
    local_408 = in_RCX[4];
    uStack_400 = in_RCX[5];
    local_3f8 = in_RCX[6];
    uStack_3f0 = in_RCX[7];
    uStack_420 = in_RCX[2];
    quantize_to_int8((Mat *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                     in_stack_fffffffffffffa18,
                     (Mat *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                     in_stack_fffffffffffffa08);
    local_2f8 = &local_3e0;
    if (local_3e0 != (void *)0x0) {
      local_b8 = local_2f8;
    }
    if (local_3e0 == (void *)0x0 || local_3a0 * local_3a8 == 0) {
      local_354 = -100;
      local_438 = 1;
      goto LAB_001c74e2;
    }
  }
  local_350 = &local_480;
  local_480 = (void *)0x0;
  local_478 = (int *)0x0;
  local_470 = 0;
  local_468 = 0;
  local_460 = (long *)0x0;
  local_458 = 0;
  local_454 = 0;
  local_450 = 0;
  local_44c = 0;
  local_448 = 0;
  local_440 = 0;
  make_padding(in_stack_fffffffffffff910,in_stack_fffffffffffff908,
               (Mat *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               in_stack_fffffffffffff8f8);
  local_300 = &local_480;
  if (local_480 != (void *)0x0) {
    local_b0 = local_300;
  }
  local_5f9 = local_480 != (void *)0x0 && local_440 * local_448 != 0;
  if (local_5f9) {
    local_37c = local_454;
    local_380 = local_450;
    local_484 = (local_454 - local_394) / *(int *)(in_RDI + 0xe4) + 1;
    local_488 = (local_450 - local_398) / *(int *)(in_RDI + 0xe8) + 1;
    local_48c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
    std::allocator<int>::allocator((allocator<int> *)0x1c5e58);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918,(allocator_type *)in_stack_fffffffffffff910);
    std::allocator<int>::~allocator((allocator<int> *)0x1c5e84);
    local_4b8 = std::vector<int,_std::allocator<int>_>::operator[](&local_4a8,0);
    local_4bc = 0;
    local_4c0 = 0;
    local_4c4 = local_37c * *(int *)(in_RDI + 0xe0) -
                *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xdc);
    for (local_4c8 = 0; local_4c8 < *(int *)(in_RDI + 0xd8); local_4c8 = local_4c8 + 1) {
      for (local_4cc = 0; local_4cc < *(int *)(in_RDI + 0xd4); local_4cc = local_4cc + 1) {
        local_4b8[local_4bc] = local_4c0;
        local_4bc = local_4bc + 1;
        local_4c0 = *(int *)(in_RDI + 0xdc) + local_4c0;
      }
      local_4c0 = local_4c4 + local_4c0;
    }
    local_4cd = 100 < *(int *)(in_RDI + 0x108);
    local_4d8 = (ulong)(((byte)~local_4cd & 1) * 3 + 1);
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                (int)((ulong)in_stack_fffffffffffff928 >> 0x20),(int)in_stack_fffffffffffff928,
                in_stack_fffffffffffff924,in_stack_fffffffffffff918,
                (Allocator *)in_stack_fffffffffffff910);
    local_308 = local_370;
    bVar3 = true;
    if (*local_370 != 0) {
      local_a8 = local_370;
      bVar3 = local_370[8] * (long)(int)local_370[7] == 0;
    }
    if (bVar3) {
      local_354 = -100;
    }
    else {
      for (local_4dc = 0; local_4dc < *(int *)(in_RDI + 0xd0); local_4dc = local_4dc + 1) {
        local_2b0 = &local_530;
        local_74 = *(int *)((long)local_370 + 0x2c);
        local_78 = (int)local_370[6];
        local_7c = *(undefined4 *)((long)local_370 + 0x34);
        local_4e8 = (float *)(*local_370 + local_370[8] * (long)local_4dc * local_370[2]);
        local_90 = local_370[2];
        local_94 = (undefined4)local_370[3];
        local_a0 = local_370[4];
        local_70 = &local_530;
        local_18 = (long)local_74 * (long)local_78 * local_90;
        local_2a0 = &local_530;
        local_348 = &local_530;
        local_1c = 0x10;
        local_2bc = local_4dc;
        local_2bd = 1;
        local_530 = 0;
        local_520 = 0;
        local_518 = 0;
        local_508 = 0;
        local_504 = 0;
        local_500 = 0;
        local_4fc = 0;
        local_4f8 = 0;
        local_4f0 = 0;
        local_528 = 0;
        local_110 = local_348;
        local_88 = local_4e8;
        local_510 = local_a0;
        for (local_534 = 0; local_534 < local_488; local_534 = local_534 + 1) {
          for (local_538 = 0; local_538 < local_484; local_538 = local_538 + 1) {
            local_53c = 0;
            local_298 = (long *)(in_RDI + 0x160);
            local_548 = *local_298 + (long)(local_48c * local_384 * local_4dc);
            for (local_54c = 0; local_54c < local_384; local_54c = local_54c + 1) {
              local_2d0 = &local_598;
              local_2d8 = &local_480;
              local_50 = (void *)((long)local_480 + local_440 * local_54c * local_470);
              local_38 = &local_598;
              local_578 = local_460;
              local_28 = (long)local_454 * (long)local_450 * local_470;
              local_2c = 0x10;
              local_44 = local_44c;
              local_58 = local_470;
              local_5c = local_468;
              local_68 = local_460;
              local_2dc = local_54c;
              local_2dd = 1;
              local_28c = local_534 * *(int *)(in_RDI + 0xe8);
              local_288 = &local_598;
              for (local_5a4 = 0; local_5a4 < local_48c; local_5a4 = local_5a4 + 1) {
                local_53c = (int)*(char *)((long)local_50 +
                                          (long)local_4b8[local_5a4] +
                                          (long)(local_538 * *(int *)(in_RDI + 0xe4)) +
                                          (long)local_454 * (long)local_28c * local_470) *
                            (int)*(char *)(local_548 + local_5a4) + local_53c;
              }
              local_548 = local_548 + local_48c;
              local_338 = &local_598;
              local_598 = 0;
              local_588 = 0;
              local_580 = 0;
              local_570 = 0;
              local_56c = 0;
              local_568 = 0;
              local_564 = 0;
              local_560 = 0;
              local_558 = 0;
              local_590 = 0;
              local_130 = local_338;
            }
            local_238 = (long *)(in_RDI + 0x1f0);
            local_240 = (long)local_4dc;
            fVar4 = *(float *)(*local_238 + local_240 * 4);
            if ((fVar4 != 0.0) || (NAN(fVar4))) {
              local_248 = (undefined8 *)(in_RDI + 0x238);
              local_250 = 0;
              local_258 = (long *)(in_RDI + 0x1f0);
              local_260 = (long)local_4dc;
              local_5b0 = 1.0 / (*(float *)*local_248 * *(float *)(*local_258 + local_260 * 4));
            }
            else {
              local_5b0 = 0.0;
            }
            local_5b4 = (float)local_53c * local_5b0;
            if (*(int *)(in_RDI + 0x100) != 0) {
              local_268 = (long *)(in_RDI + 0x1a8);
              local_270 = (long)local_4dc;
              local_5b4 = *(float *)(*local_268 + local_270 * 4) + local_5b4;
            }
            local_200 = *(undefined4 *)(in_RDI + 0x10c);
            local_208 = (long *)(in_RDI + 0x110);
            local_1fc[0] = local_5b4;
            switch(local_200) {
            case 1:
              if (local_5b4 <= 0.0) {
                local_1fc[0] = 0.0;
              }
              break;
            case 2:
              local_1b8 = 0;
              local_20c = *(float *)*local_208;
              if (local_5b4 <= 0.0) {
                local_6c4 = local_5b4 * local_20c;
              }
              else {
                local_6c4 = local_5b4;
              }
              local_1fc[0] = local_6c4;
              local_1b0 = local_208;
              break;
            case 3:
              local_1c8 = 0;
              local_210 = *(float *)*local_208;
              local_1d8 = 1;
              local_214 = *(float *)(*local_208 + 4);
              if (local_5b4 < local_210) {
                local_1fc[0] = local_210;
              }
              local_1d0 = local_208;
              local_1c0 = local_208;
              if (local_214 < local_1fc[0]) {
                local_1fc[0] = local_214;
              }
              break;
            case 4:
              local_218 = 88.37626;
              pfVar2 = std::min<float>(local_1fc,&local_218);
              local_1fc[0] = *pfVar2;
              local_21c = -88.37626;
              pfVar2 = std::max<float>(local_1fc,&local_21c);
              local_1fc[0] = *pfVar2;
              fVar4 = expf(-local_1fc[0]);
              local_1fc[0] = 1.0 / (fVar4 + 1.0);
              break;
            case 5:
              fVar4 = expf(local_5b4);
              fVar4 = logf(fVar4 + 1.0);
              local_1fc[0] = tanhf(fVar4);
              local_1fc[0] = local_5b4 * local_1fc[0];
              break;
            case 6:
              local_1e8 = 0;
              local_220 = *(float *)*local_208;
              local_1fc[1] = 1.4013e-45;
              local_1fc[2] = 0.0;
              local_224 = *(float *)(*local_208 + 4);
              local_228 = -local_224 / local_220;
              local_22c = 1.0 / local_220 + local_228;
              local_1f0 = local_208;
              local_1e0 = local_208;
              if (local_228 <= local_5b4) {
                if (local_5b4 <= local_22c) {
                  local_1fc[0] = local_5b4 * (local_5b4 * local_220 + local_224);
                }
              }
              else {
                local_1fc[0] = 0.0;
              }
            }
            if ((local_4cd & 1) == 0) {
              *local_4e8 = local_1fc[0];
              local_4e8 = local_4e8 + 1;
            }
            else {
              local_278 = in_RDI + 0x280;
              local_280 = 0;
              cVar1 = float2int8(in_stack_fffffffffffff900);
              *(char *)local_4e8 = cVar1;
              local_4e8 = (float *)((long)local_4e8 + 1);
            }
          }
        }
      }
      local_354 = 0;
    }
    local_438 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff910);
  }
  else {
    local_354 = -100;
    local_438 = 1;
  }
  ppvVar5 = &local_480;
  local_328 = ppvVar5;
  local_150 = ppvVar5;
  if (local_478 != (int *)0x0) {
    local_154 = 0xffffffff;
    LOCK();
    local_158 = *local_478;
    *local_478 = *local_478 + -1;
    UNLOCK();
    if (local_158 == 1) {
      if (local_460 == (long *)0x0) {
        local_e8 = local_480;
        if (local_480 != (void *)0x0) {
          free(local_480);
        }
      }
      else {
        (**(code **)(*local_460 + 0x18))(local_460,local_480);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
LAB_001c74e2:
  ppvVar5 = &local_3e0;
  if (local_3d8 != (int *)0x0) {
    local_174 = 0xffffffff;
    LOCK();
    local_178 = *local_3d8;
    *local_3d8 = *local_3d8 + -1;
    UNLOCK();
    if (local_178 == 1) {
      local_318 = ppvVar5;
      local_170 = ppvVar5;
      if (local_3c0 == (long *)0x0) {
        local_d8 = local_3e0;
        if (local_3e0 != (void *)0x0) {
          free(local_3e0);
        }
      }
      else {
        (**(code **)(*local_3c0 + 0x18))(local_3c0,local_3e0);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  return local_354;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
        if (bottom_blob_unbordered.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}